

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

size_t json_object_get_cell_ix
                 (JSON_Object *object,char *key,size_t key_len,unsigned_long hash,
                 parson_bool_t *out_found)

{
  long lVar1;
  long lVar2;
  char *__s;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  ulong in_RCX;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  size_t key_to_check_len;
  char *key_to_check;
  unsigned_long hash_to_check;
  uint i;
  size_t ix;
  size_t cell;
  size_t cell_ix;
  uint local_4c;
  
  lVar1 = *(long *)(in_RDI + 0x40);
  *in_R8 = 0;
  local_4c = 0;
  while( true ) {
    if (*(ulong *)(in_RDI + 0x40) <= (ulong)local_4c) {
      return 0xffffffffffffffff;
    }
    uVar4 = (in_RCX & lVar1 - 1U) + (ulong)local_4c & *(long *)(in_RDI + 0x40) - 1U;
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + uVar4 * 8);
    if (lVar2 == -1) break;
    if (in_RCX == *(ulong *)(*(long *)(in_RDI + 0x10) + lVar2 * 8)) {
      __s = *(char **)(*(long *)(in_RDI + 0x18) + lVar2 * 8);
      sVar5 = strlen(__s);
      if ((sVar5 == in_RDX) && (iVar3 = strncmp(in_RSI,__s,in_RDX), iVar3 == 0)) {
        *in_R8 = 1;
        return uVar4;
      }
    }
    local_4c = local_4c + 1;
  }
  return uVar4;
}

Assistant:

static size_t json_object_get_cell_ix(const JSON_Object *object, const char *key, size_t key_len, unsigned long hash, parson_bool_t *out_found) {
    size_t cell_ix = hash & (object->cell_capacity - 1);
    size_t cell = 0;
    size_t ix = 0;
    unsigned int i = 0;
    unsigned long hash_to_check = 0;
    const char *key_to_check = NULL;
    size_t key_to_check_len = 0;

    *out_found = PARSON_FALSE;

    for (i = 0; i < object->cell_capacity; i++) {
        ix = (cell_ix + i) & (object->cell_capacity - 1);
        cell = object->cells[ix];
        if (cell == OBJECT_INVALID_IX) {
            return ix;
        }
        hash_to_check = object->hashes[cell];
        if (hash != hash_to_check) {
            continue;
        }
        key_to_check = object->names[cell];
        key_to_check_len = strlen(key_to_check);
        if (key_to_check_len == key_len && strncmp(key, key_to_check, key_len) == 0) {
            *out_found = PARSON_TRUE;
            return ix;
        }
    }
    return OBJECT_INVALID_IX;
}